

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O0

int ARKodeSetRelaxMaxIters(void *arkode_mem,int max_iters)

{
  int in_ESI;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffd8;
  ARKodeMem in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = arkRelaxAccessMem((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                              (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                              (ARKodeRelaxMem *)0x18f6d6);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffe0->step_supports_relaxation == 0) {
      arkProcessError(in_stack_ffffffffffffffe0,-0x30,0x20a,"ARKodeSetRelaxMaxIters",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
      local_4 = -0x30;
    }
    else {
      if (in_ESI < 1) {
        *(undefined4 *)(in_stack_ffffffffffffffd8 + 0x15) = 10;
      }
      else {
        *(int *)(in_stack_ffffffffffffffd8 + 0x15) = in_ESI;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetRelaxMaxIters(void* arkode_mem, int max_iters)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (max_iters > 0) { relax_mem->max_iters = max_iters; }
  else { relax_mem->max_iters = ARK_RELAX_DEFAULT_MAX_ITERS; }

  return ARK_SUCCESS;
}